

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O3

void Cnf_CutFree(Cnf_Cut_t *pCut)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = pCut->vIsop[0];
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar1 = pCut->vIsop[1];
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
    return;
  }
  return;
}

Assistant:

void Cnf_CutFree( Cnf_Cut_t * pCut )
{
    if ( pCut->vIsop[0] )
        Vec_IntFree( pCut->vIsop[0] );
    if ( pCut->vIsop[1] )
        Vec_IntFree( pCut->vIsop[1] );
}